

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O3

void Cbs_ManStop(Cbs_Man_t *p)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  Vec_Ptr_t *__ptr;
  void **__ptr_00;
  Gia_Obj_t **ppGVar3;
  
  pVVar1 = p->vLevReas;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vModel;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  __ptr = p->vTemp;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  ppGVar3 = (p->pClauses).pData;
  if (ppGVar3 != (Gia_Obj_t **)0x0) {
    free(ppGVar3);
    (p->pClauses).pData = (Gia_Obj_t **)0x0;
  }
  ppGVar3 = (p->pProp).pData;
  if (ppGVar3 != (Gia_Obj_t **)0x0) {
    free(ppGVar3);
    (p->pProp).pData = (Gia_Obj_t **)0x0;
  }
  ppGVar3 = (p->pJust).pData;
  if (ppGVar3 != (Gia_Obj_t **)0x0) {
    free(ppGVar3);
  }
  free(p);
  return;
}

Assistant:

void Cbs_ManStop( Cbs_Man_t * p )
{
    Vec_IntFree( p->vLevReas );
    Vec_IntFree( p->vModel );
    Vec_PtrFree( p->vTemp );
    ABC_FREE( p->pClauses.pData );
    ABC_FREE( p->pProp.pData );
    ABC_FREE( p->pJust.pData );
    ABC_FREE( p );
}